

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monotone.c
# Opt level: O0

int findPendingSignal(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Abc_Obj_t *pObj;
  char *pcVar2;
  Abc_Obj_t *pNode;
  int pendingSignalIndex;
  int i;
  Abc_Ntk_t *pNtk_local;
  
  pNode._4_4_ = 0;
  while( true ) {
    iVar1 = Abc_NtkPoNum(pNtk);
    if (iVar1 <= pNode._4_4_) {
      return -1;
    }
    pObj = Abc_NtkPo(pNtk,pNode._4_4_);
    pcVar2 = Abc_ObjName(pObj);
    pcVar2 = strstr(pcVar2,"pendingSignal");
    if (pcVar2 != (char *)0x0) break;
    pNode._4_4_ = pNode._4_4_ + 1;
  }
  return pNode._4_4_;
}

Assistant:

int findPendingSignal(Abc_Ntk_t *pNtk)
{
    int i, pendingSignalIndex = -1;
    Abc_Obj_t *pNode;

    Abc_NtkForEachPo( pNtk, pNode, i )
    {
        if( strstr( Abc_ObjName( pNode ), "pendingSignal" ) != NULL )
        {
            pendingSignalIndex = i;
            break;
        }
    }    
    
    return pendingSignalIndex;
}